

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Detail::
rangeToString<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (string *__return_storage_ptr__,Detail *this,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last)

{
  Detail *pDVar1;
  ostringstream oss;
  char in_stack_fffffffffffffe2f;
  char *local_1c8;
  long local_1c0;
  char local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{ ",2);
  if (this != (Detail *)first._M_current) {
    Catch::toString_abi_cxx11_(in_stack_fffffffffffffe2f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1c8,local_1c0);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8);
    }
    pDVar1 = this + 1;
    if (pDVar1 != (Detail *)first._M_current) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        Catch::toString_abi_cxx11_(in_stack_fffffffffffffe2f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1c8,local_1c0)
        ;
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8);
        }
        pDVar1 = pDVar1 + 1;
      } while (pDVar1 != (Detail *)first._M_current);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," }",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString( InputIterator first, InputIterator last ) {
        std::ostringstream oss;
        oss << "{ ";
        if( first != last ) {
            oss << Catch::toString( *first );
            for( ++first ; first != last ; ++first )
                oss << ", " << Catch::toString( *first );
        }
        oss << " }";
        return oss.str();
    }